

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLExporter.cpp
# Opt level: O1

void __thiscall Assimp::STLExporter::WriteMesh(STLExporter *this,aiMesh *m)

{
  uint uVar1;
  aiVector3D *paVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ostream *poVar6;
  ulong uVar7;
  ulong uVar8;
  aiFace *paVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  
  if (m->mNumFaces != 0) {
    uVar7 = 0;
    do {
      paVar9 = m->mFaces + uVar7;
      paVar2 = m->mNormals;
      if (paVar2 == (aiVector3D *)0x0) {
        auVar3._8_8_ = 0;
        auVar3._0_8_ = local_68._8_8_;
        local_68 = auVar3 << 0x40;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = local_78._8_8_;
        local_78 = auVar4 << 0x40;
        auVar5._8_8_ = 0;
        auVar5._0_8_ = local_88._8_8_;
        local_88 = auVar5 << 0x40;
      }
      else {
        if ((ulong)paVar9->mNumIndices == 0) {
          fVar14 = 0.0;
          fVar13 = 0.0;
          fVar12 = 0.0;
        }
        else {
          fVar12 = 0.0;
          uVar8 = 0;
          fVar13 = 0.0;
          fVar14 = 0.0;
          do {
            uVar1 = paVar9->mIndices[uVar8];
            fVar12 = fVar12 + paVar2[uVar1].x;
            fVar13 = fVar13 + paVar2[uVar1].y;
            fVar14 = fVar14 + paVar2[uVar1].z;
            uVar8 = uVar8 + 1;
          } while (paVar9->mNumIndices != uVar8);
        }
        fVar10 = fVar14 * fVar14 + fVar12 * fVar12 + fVar13 * fVar13;
        if (fVar10 < 0.0) {
          local_68._8_8_ = 0;
          local_78._8_8_ = 0;
          local_88._8_8_ = 0;
          fVar10 = sqrtf(fVar10);
        }
        else {
          fVar10 = SQRT(fVar10);
        }
        fVar11 = 1.0 / fVar10;
        if (0.0 < fVar10) {
          fVar12 = fVar12 * fVar11;
          fVar13 = fVar13 * fVar11;
        }
        local_88._0_8_ = (double)fVar12;
        local_78._0_8_ = (double)fVar13;
        local_68._0_8_ =
             (double)(float)(~-(uint)(0.0 < fVar10) & (uint)fVar14 |
                            (uint)(fVar11 * fVar14) & -(uint)(0.0 < fVar10));
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," facet normal ",0xe);
      poVar6 = std::ostream::_M_insert<double>((double)local_88._0_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      poVar6 = std::ostream::_M_insert<double>((double)local_78._0_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
      poVar6 = std::ostream::_M_insert<double>((double)local_68._0_8_);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"  outer loop",0xc);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
      if (paVar9->mNumIndices != 0) {
        uVar8 = 0;
        do {
          paVar2 = m->mVertices;
          uVar1 = paVar9->mIndices[uVar8];
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"  vertex ",9);
          poVar6 = std::ostream::_M_insert<double>((double)paVar2[uVar1].x);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
          poVar6 = std::ostream::_M_insert<double>((double)paVar2[uVar1].y);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
          poVar6 = std::ostream::_M_insert<double>((double)paVar2[uVar1].z);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
          uVar8 = uVar8 + 1;
        } while (uVar8 < paVar9->mNumIndices);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"  endloop",9);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," endfacet",9);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)this,(this->endl)._M_dataplus._M_p,
                          (this->endl)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar6,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
      uVar7 = uVar7 + 1;
    } while (uVar7 < m->mNumFaces);
  }
  return;
}

Assistant:

void STLExporter::WriteMesh(const aiMesh* m)
{
    for (unsigned int i = 0; i < m->mNumFaces; ++i) {
        const aiFace& f = m->mFaces[i];

        // we need per-face normals. We specified aiProcess_GenNormals as pre-requisite for this exporter,
        // but nonetheless we have to expect per-vertex normals.
        aiVector3D nor;
        if (m->mNormals) {
            for(unsigned int a = 0; a < f.mNumIndices; ++a) {
                nor += m->mNormals[f.mIndices[a]];
            }
            nor.NormalizeSafe();
        }
        mOutput << " facet normal " << nor.x << " " << nor.y << " " << nor.z << endl;
        mOutput << "  outer loop" << endl;
        for(unsigned int a = 0; a < f.mNumIndices; ++a) {
            const aiVector3D& v  = m->mVertices[f.mIndices[a]];
            mOutput << "  vertex " << v.x << " " << v.y << " " << v.z << endl;
        }

        mOutput << "  endloop" << endl;
        mOutput << " endfacet" << endl << endl;
    }
}